

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O1

UBool __thiscall icu_63::ExtraData::setNoNoDelta(ExtraData *this,UChar32 c,Norm *norm)

{
  UChar32 c_00;
  int iVar1;
  Norm *pNVar2;
  
  c_00 = norm->mappingCP;
  if ((((-1 < c_00) && (0x7f < c || c_00 < 0x80)) &&
      (pNVar2 = Norms::getNormRef((this->super_Enumerator).norms,c_00), (int)pNVar2->type < 5)) &&
     (iVar1 = norm->mappingCP - c, 0xffffff7e < iVar1 - 0x41U)) {
    norm->type = NO_NO_DELTA;
    norm->offset = iVar1;
    return '\x01';
  }
  return '\0';
}

Assistant:

UBool ExtraData::setNoNoDelta(UChar32 c, Norm &norm) const {
    // Try a compact, algorithmic encoding to a single compYesAndZeroCC code point.
    // Do not map from ASCII to non-ASCII.
    if(norm.mappingCP>=0 &&
            !(c<=0x7f && norm.mappingCP>0x7f) &&
            norms.getNormRef(norm.mappingCP).type<Norm::NO_NO_COMP_YES) {
        int32_t delta=norm.mappingCP-c;
        if(-Normalizer2Impl::MAX_DELTA<=delta && delta<=Normalizer2Impl::MAX_DELTA) {
            norm.type=Norm::NO_NO_DELTA;
            norm.offset=delta;
            return TRUE;
        }
    }
    return FALSE;
}